

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

void hdr_iter_log_init(hdr_iter *iter,hdr_histogram *h,int64_t value_units_first_bucket,
                      double log_base)

{
  int64_t iVar1;
  
  iter->h = h;
  iter->counts_index = -1;
  iter->total_count = h->total_count;
  iter->count = 0;
  iter->cumulative_count = 0;
  iter->value = 0;
  iter->highest_equivalent_value = 0;
  iter->value_iterated_from = 0;
  iter->value_iterated_to = 0;
  iter->_next_fp = all_values_iter_next;
  (iter->specifics).percentiles.percentile_to_iterate_to = 0.0;
  (iter->specifics).log.log_base = log_base;
  (iter->specifics).linear.next_value_reporting_level = value_units_first_bucket;
  iVar1 = lowest_equivalent_value(h,value_units_first_bucket);
  (iter->specifics).linear.next_value_reporting_level_lowest_equivalent = iVar1;
  iter->_next_fp = log_iter_next;
  return;
}

Assistant:

void hdr_iter_log_init(
        struct hdr_iter* iter,
        const struct hdr_histogram* h,
        int64_t value_units_first_bucket,
        double log_base)
{
    hdr_iter_init(iter, h);
    iter->specifics.log.count_added_in_this_iteration_step = 0;
    iter->specifics.log.log_base = log_base;
    iter->specifics.log.next_value_reporting_level = value_units_first_bucket;
    iter->specifics.log.next_value_reporting_level_lowest_equivalent = lowest_equivalent_value(h, value_units_first_bucket);

    iter->_next_fp = log_iter_next;
}